

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O2

Bal_Man_t * Bal_ManAlloc(Gia_Man_t *pGia,Gia_Man_t *pNew,int nLutSize,int nCutNum,int fVerbose)

{
  uint nCapMin;
  int iVar1;
  Bal_Man_t *pBVar2;
  long lVar3;
  Vec_Int_t *p;
  Vec_Ptr_t *p_00;
  void **ppvVar4;
  ulong uVar5;
  int extraout_EDX;
  int extraout_EDX_00;
  ulong uVar6;
  int iVar7;
  timespec local_40;
  
  pBVar2 = (Bal_Man_t *)calloc(1,0x38);
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  pBVar2->clkStart = lVar3;
  pBVar2->pGia = pGia;
  pBVar2->pNew = pNew;
  pBVar2->nLutSize = nLutSize;
  pBVar2->nCutNum = nCutNum;
  pBVar2->fVerbose = fVerbose;
  p = Vec_IntAlloc((pGia->nObjs * 3) / 2);
  pBVar2->vCosts = p;
  iVar7 = (pGia->nObjs * 3) / 2;
  p_00 = (Vec_Ptr_t *)malloc(0x10);
  iVar1 = 8;
  if (6 < iVar7 - 1U) {
    iVar1 = iVar7;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar1;
  uVar6 = 0;
  if (iVar1 == 0) {
    ppvVar4 = (void **)0x0;
    iVar1 = extraout_EDX;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar1 << 3);
    iVar1 = extraout_EDX_00;
  }
  p_00->pArray = ppvVar4;
  pBVar2->vCutSets = p_00;
  Vec_IntFill(p,pNew->nObjs,iVar1);
  nCapMin = pNew->nObjs;
  Vec_PtrGrow(p_00,nCapMin);
  uVar5 = 0;
  if (0 < (int)nCapMin) {
    uVar5 = (ulong)nCapMin;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    p_00->pArray[uVar6] = (void *)0x0;
  }
  p_00->nSize = nCapMin;
  pNew->pData = pBVar2;
  return pBVar2;
}

Assistant:

Bal_Man_t * Bal_ManAlloc( Gia_Man_t * pGia, Gia_Man_t * pNew, int nLutSize, int nCutNum, int fVerbose )
{
    Bal_Man_t * p;
    p = ABC_CALLOC( Bal_Man_t, 1 );
    p->clkStart = Abc_Clock();
    p->pGia     = pGia;
    p->pNew     = pNew;
    p->nLutSize = nLutSize;
    p->nCutNum  = nCutNum;
    p->fVerbose = fVerbose;
    p->vCosts   = Vec_IntAlloc( 3 * Gia_ManObjNum(pGia) / 2 );
    p->vCutSets = Vec_PtrAlloc( 3 * Gia_ManObjNum(pGia) / 2 );
    Vec_IntFill( p->vCosts, Gia_ManObjNum(pNew), 0 );
    Vec_PtrFill( p->vCutSets, Gia_ManObjNum(pNew), NULL );
    pNew->pData = p;
    return p;
}